

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O3

void __thiscall leveldb::CorruptionTest::Build(CorruptionTest *this,int n)

{
  int i;
  Slice key;
  string value_space;
  string key_space;
  WriteBatch batch;
  undefined1 local_249;
  Status local_248;
  Slice local_240;
  string local_230;
  string local_210;
  WriteBatch local_1f0;
  Slice local_1d0;
  int local_1c0;
  stringstream local_1b8 [392];
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  WriteBatch::WriteBatch(&local_1f0);
  if (0 < n) {
    i = 0;
    do {
      local_240 = Key(this,i,&local_210);
      WriteBatch::Clear(&local_1f0);
      if ((i == 0x7fffffff) || (local_248.state_._0_4_ = i, i == 0)) {
        local_248.state_._0_4_ = 1;
      }
      local_1d0 = test::RandomString((Random *)&local_248,1000,&local_230);
      WriteBatch::Put(&local_1f0,&local_240,&local_1d0);
      local_249 = i - n == -1;
      local_1d0.data_._0_1_ = 1;
      local_1d0.size_ =
           (size_t)
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
      ;
      local_1c0 = 0x47;
      std::__cxx11::stringstream::stringstream(local_1b8);
      (*this->db_->_vptr_DB[4])(&local_248,this->db_,&local_249,&local_1f0);
      test::Tester::IsOk((Tester *)&local_1d0,&local_248);
      if ((void *)CONCAT44(local_248.state_._4_4_,(int)local_248.state_) != (void *)0x0) {
        operator_delete__((void *)CONCAT44(local_248.state_._4_4_,(int)local_248.state_));
      }
      test::Tester::~Tester((Tester *)&local_1d0);
      i = i + 1;
    } while (i != n);
  }
  WriteBatch::~WriteBatch(&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Build(int n) {
    std::string key_space, value_space;
    WriteBatch batch;
    for (int i = 0; i < n; i++) {
      // if ((i % 100) == 0) fprintf(stderr, "@ %d of %d\n", i, n);
      Slice key = Key(i, &key_space);
      batch.Clear();
      batch.Put(key, Value(i, &value_space));
      WriteOptions options;
      // Corrupt() doesn't work without this sync on windows; stat reports 0 for
      // the file size.
      if (i == n - 1) {
        options.sync = true;
      }
      ASSERT_OK(db_->Write(options, &batch));
    }
  }